

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O1

CURLcode curl_ws_send(CURL *data,void *buffer,size_t buflen,size_t *sent,curl_off_t fragsize,
                     uint flags)

{
  undefined8 uVar1;
  curl_trc_feat *pcVar2;
  websocket *pwVar3;
  bufq *pbVar4;
  ulong uVar5;
  _Bool _Var6;
  CURLcode CVar7;
  size_t sVar8;
  size_t sVar9;
  ssize_t sVar10;
  ulong uVar11;
  size_t *psVar12;
  char *fmt;
  CURLcode local_5c;
  bufq *local_58;
  uint local_4c;
  size_t local_48;
  ulong local_40;
  ws_encoder *local_38;
  
  psVar12 = sent;
  if ((((data != (CURL *)0x0) &&
       (uVar1 = *(undefined8 *)&(data->set).field_0x8ca, ((uint)uVar1 >> 0x1c & 1) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_ws.log_level)) {
    psVar12 = (size_t *)fragsize;
    Curl_trc_ws(data,"curl_ws_send(len=%zu, fragsize=%ld, flags=%x), raw=%d",buflen,fragsize,flags,
                (ulong)((uint)((ulong)uVar1 >> 0x35) & 1));
  }
  *sent = 0;
  local_4c = flags;
  local_48 = fragsize;
  if ((data->conn == (connectdata *)0x0) && ((data->set).connect_only != '\0')) {
    CVar7 = Curl_connect_only_attach(data);
    uVar5 = local_40;
    if (CVar7 != CURLE_OK) goto LAB_00168167;
    local_5c = CURLE_OK;
  }
  if (data->conn == (connectdata *)0x0) {
    fmt = "No associated connection";
  }
  else {
    pwVar3 = (data->conn->proto).ws;
    if (pwVar3 != (websocket *)0x0) {
      local_5c = ws_flush(data,pwVar3,false);
      CVar7 = local_5c;
      uVar5 = local_40;
      if (local_5c != CURLE_OK) goto LAB_00168167;
      if (((data->set).field_0x8d0 & 0x20) != 0) {
        sVar8 = CONCAT71((int7)((ulong)psVar12 >> 8),flags == 0);
        if (local_48 != 0 || flags != 0) {
          Curl_failf(data,"ws_send, raw mode: fragsize and flags cannot be non-zero");
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pwVar3 = (data->conn->proto).ws;
        if (pwVar3 == (websocket *)0x0) {
          Curl_failf(data,"Not a websocket transfer");
          CVar7 = CURLE_SEND_ERROR;
          uVar5 = local_40;
        }
        else if (buflen == 0) {
          CVar7 = CURLE_OK;
        }
        else {
          _Var6 = Curl_is_in_callback(data);
          if (_Var6) {
            CVar7 = ws_flush(data,pwVar3,true);
            uVar5 = local_40;
            if (CVar7 != CURLE_OK) goto LAB_00168167;
            CVar7 = ws_send_raw_blocking(data,(websocket *)buffer,(char *)buflen,sVar8);
          }
          else {
            CVar7 = ws_flush(data,pwVar3,false);
            uVar5 = local_40;
            if (CVar7 != CURLE_OK) goto LAB_00168167;
            CVar7 = Curl_senddata(data,buffer,buflen,sent);
          }
          uVar5 = local_40;
          if ((((data != (CURL *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
              ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_ws.log_level)) {
            Curl_trc_ws(data,"ws_send_raw(len=%zu) -> %d, %zu",buflen,(ulong)CVar7,*sent);
            uVar5 = local_40;
          }
        }
        goto LAB_00168167;
      }
      local_58 = &pwVar3->sendbuf;
      sVar8 = Curl_bufq_space(local_58);
      if (((data != (CURL *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
          && (0 < Curl_trc_feat_ws.log_level)))) {
        sVar9 = Curl_bufq_len(local_58);
        Curl_trc_ws(data,"curl_ws_send(len=%zu), sendbuf=%zu space_left=%zu",buflen,sVar9,sVar8);
      }
      pbVar4 = local_58;
      if (sVar8 < 0xe) {
        local_5c = CURLE_AGAIN;
        CVar7 = local_5c;
        uVar5 = local_40;
        goto LAB_00168167;
      }
      if ((local_4c & 0x20) == 0) {
        sVar8 = buflen;
        if ((pwVar3->enc).payload_remain == 0) {
LAB_001682aa:
          sVar10 = ws_enc_write_head(data,&pwVar3->enc,local_4c,sVar8,local_58,&local_5c);
          CVar7 = local_5c;
          uVar5 = local_40;
          if (sVar10 < 0) goto LAB_00168167;
        }
      }
      else {
        sVar8 = local_48;
        if (local_48 != 0) goto LAB_001682aa;
        if ((((data != (CURL *)0x0) && ((pwVar3->enc).payload_remain < (long)buflen)) &&
            (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          Curl_infof(data,"WS: unaligned frame size (sending %zu instead of %ld)",buflen);
        }
      }
      local_38 = &pwVar3->enc;
      uVar11 = ws_enc_write_payload(local_38,data,(uchar *)buffer,buflen,pbVar4,&local_5c);
      CVar7 = local_5c;
      uVar5 = local_40;
      local_40 = uVar11;
      if (-1 < (long)uVar11) {
        while (CVar7 = local_5c, local_5c == CURLE_OK) {
          if ((buflen == 0) && (_Var6 = Curl_bufq_is_empty(local_58), _Var6)) {
            buflen = 0;
            CVar7 = local_5c;
            uVar5 = local_40;
            break;
          }
          _Var6 = Curl_is_in_callback(data);
          local_5c = ws_flush(data,pwVar3,_Var6);
          pbVar4 = local_58;
          uVar5 = local_40;
          if (local_5c == CURLE_AGAIN) {
            if (uVar11 < buflen) {
              *sent = uVar11;
              local_5c = CURLE_OK;
              CVar7 = local_5c;
              break;
            }
            if (buflen == 0) {
              *sent = local_40;
              CVar7 = ws_flush(data,pwVar3,true);
              uVar5 = local_40;
              break;
            }
            *sent = uVar11 - 1;
            local_5c = Curl_bufq_unwrite(local_58,1);
            uVar5 = local_40;
            if (local_5c == CURLE_OK) {
              local_5c = CURLE_AGAIN;
            }
          }
          else if (local_5c == CURLE_OK) {
            *sent = *sent + uVar11;
            buffer = (void *)((long)buffer + uVar11);
            buflen = buflen - uVar11;
            if (buflen == 0) {
              buflen = 0;
              uVar11 = 0;
            }
            else {
              local_40 = ws_enc_write_payload
                                   (local_38,data,(uchar *)buffer,buflen,local_58,&local_5c);
              CVar7 = local_5c;
              uVar5 = local_40;
              if ((long)local_40 < 0) break;
              uVar11 = Curl_bufq_len(pbVar4);
              uVar5 = local_40;
            }
          }
        }
      }
      goto LAB_00168167;
    }
    fmt = "Not a websocket transfer";
  }
  Curl_failf(data,fmt);
  local_5c = CURLE_SEND_ERROR;
  CVar7 = local_5c;
  uVar5 = local_40;
LAB_00168167:
  local_40 = uVar5;
  local_5c = CVar7;
  if ((((data != (CURL *)0x0) &&
       (uVar1 = *(undefined8 *)&(data->set).field_0x8ca, ((uint)uVar1 >> 0x1c & 1) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_ws.log_level)) {
    Curl_trc_ws(data,"curl_ws_send(len=%zu, fragsize=%ld, flags=%x, raw=%d) -> %d, %zu",buflen,
                local_48,(ulong)local_4c,(ulong)((uint)((ulong)uVar1 >> 0x35) & 1),(ulong)local_5c,
                *sent);
  }
  return local_5c;
}

Assistant:

CURL_EXTERN CURLcode curl_ws_send(CURL *data, const void *buffer,
                                  size_t buflen, size_t *sent,
                                  curl_off_t fragsize,
                                  unsigned int flags)
{
  struct websocket *ws;
  ssize_t n;
  size_t space, payload_added;
  CURLcode result;

  CURL_TRC_WS(data, "curl_ws_send(len=%zu, fragsize=%" FMT_OFF_T
              ", flags=%x), raw=%d",
              buflen, fragsize, flags, data->set.ws_raw_mode);
  *sent = 0;
  if(!data->conn && data->set.connect_only) {
    result = Curl_connect_only_attach(data);
    if(result)
      goto out;
  }
  if(!data->conn) {
    failf(data, "No associated connection");
    result = CURLE_SEND_ERROR;
    goto out;
  }
  if(!data->conn->proto.ws) {
    failf(data, "Not a websocket transfer");
    result = CURLE_SEND_ERROR;
    goto out;
  }
  ws = data->conn->proto.ws;

  /* try flushing any content still waiting to be sent. */
  result = ws_flush(data, ws, FALSE);
  if(result)
    goto out;

  if(data->set.ws_raw_mode) {
    /* In raw mode, we write directly to the connection */
    if(fragsize || flags) {
      failf(data, "ws_send, raw mode: fragsize and flags cannot be non-zero");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    result = ws_send_raw(data, buffer, buflen, sent);
    goto out;
  }

  /* Not RAW mode, buf we do the frame encoding */
  space = Curl_bufq_space(&ws->sendbuf);
  CURL_TRC_WS(data, "curl_ws_send(len=%zu), sendbuf=%zu space_left=%zu",
              buflen, Curl_bufq_len(&ws->sendbuf), space);
  if(space < 14) {
    result = CURLE_AGAIN;
    goto out;
  }

  if(flags & CURLWS_OFFSET) {
    if(fragsize) {
      /* a frame series 'fragsize' bytes big, this is the first */
      n = ws_enc_write_head(data, &ws->enc, flags, fragsize,
                            &ws->sendbuf, &result);
      if(n < 0)
        goto out;
    }
    else {
      if((curl_off_t)buflen > ws->enc.payload_remain) {
        infof(data, "WS: unaligned frame size (sending %zu instead of %"
                    FMT_OFF_T ")",
              buflen, ws->enc.payload_remain);
      }
    }
  }
  else if(!ws->enc.payload_remain) {
    n = ws_enc_write_head(data, &ws->enc, flags, (curl_off_t)buflen,
                          &ws->sendbuf, &result);
    if(n < 0)
      goto out;
  }

  n = ws_enc_write_payload(&ws->enc, data,
                           buffer, buflen, &ws->sendbuf, &result);
  if(n < 0)
    goto out;
  payload_added = (size_t)n;

  while(!result && (buflen || !Curl_bufq_is_empty(&ws->sendbuf))) {
    /* flush, blocking when in callback */
    result = ws_flush(data, ws, Curl_is_in_callback(data));
    if(!result) {
      DEBUGASSERT(payload_added <= buflen);
      /* all buffered data sent. Try sending the rest if there is any. */
      *sent += payload_added;
      buffer = (const char *)buffer + payload_added;
      buflen -= payload_added;
      payload_added = 0;
      if(buflen) {
        n = ws_enc_write_payload(&ws->enc, data,
                                 buffer, buflen, &ws->sendbuf, &result);
        if(n < 0)
          goto out;
        payload_added = Curl_bufq_len(&ws->sendbuf);
      }
    }
    else if(result == CURLE_AGAIN) {
      /* partially sent. how much of the call data has been part of it? what
      * should we report to out caller so it can retry/send the rest? */
      if(payload_added < buflen) {
        /* We did not add everything the caller wanted. Return just
         * the partial write to our buffer. */
        *sent = payload_added;
        result = CURLE_OK;
        goto out;
      }
      else if(!buflen) {
        /* We have no payload to report a partial write. EAGAIN would make
         * the caller repeat this and add the frame again.
         * Flush blocking seems the only way out of this. */
        *sent = (size_t)n;
        result = ws_flush(data, ws, TRUE);
        goto out;
      }
      /* We added the complete data to our sendbuf. Report one byte less as
       * sent. This partial success should make the caller invoke us again
       * with the last byte. */
      *sent = payload_added - 1;
      result = Curl_bufq_unwrite(&ws->sendbuf, 1);
      if(!result)
        result = CURLE_AGAIN;
    }
  }

out:
  CURL_TRC_WS(data, "curl_ws_send(len=%zu, fragsize=%" FMT_OFF_T
              ", flags=%x, raw=%d) -> %d, %zu",
              buflen, fragsize, flags, data->set.ws_raw_mode, result, *sent);
  return result;
}